

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O1

bool __thiscall bssl::SSLTranscript::Update(SSLTranscript *this,Span<const_unsigned_char> in)

{
  bool bVar1;
  ulong uVar2;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  
  uVar2 = in.size_;
  in_00.data_ = in.data_;
  if (((this->field_0x28 & 1) != 0) && (0x303 < this->version_)) {
    if (0xb < uVar2) {
      in_00.size_ = 4;
      bVar1 = AddToBufferOrHash(this,in_00);
      if (bVar1) {
        in_00.data_ = in_00.data_ + 0xc;
        uVar2 = uVar2 - 0xc;
        goto LAB_0015f910;
      }
    }
    return false;
  }
LAB_0015f910:
  in_01.size_ = uVar2;
  in_01.data_ = in_00.data_;
  bVar1 = AddToBufferOrHash(this,in_01);
  return bVar1;
}

Assistant:

bool SSLTranscript::Update(Span<const uint8_t> in) {
  if (!is_dtls_ || version_ < TLS1_3_VERSION) {
    return AddToBufferOrHash(in);
  }
  if (in.size() < DTLS1_HM_HEADER_LENGTH) {
    return false;
  }
  // The message passed into Update is the whole Handshake or DTLSHandshake
  // message, including the msg_type and length. In DTLS, the DTLSHandshake
  // message also has message_seq, fragment_offset, and fragment_length
  // fields. In DTLS 1.3, those fields are omitted so that the same
  // transcript format as TLS 1.3 is used. This means we write the 1-byte
  // msg_type, 3-byte length, then skip 2+3+3 bytes for the DTLS-specific
  // fields that get omitted.
  if (!AddToBufferOrHash(in.subspan(0, 4)) ||
      !AddToBufferOrHash(in.subspan(12))) {
    return false;
  }
  return true;
}